

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O2

void __thiscall N::histo(N *this,Alg<void> *alg,vector<N_*,_std::allocator<N_*>_> *line)

{
  pointer *pppNVar1;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var2;
  N *local_70 [4];
  anon_class_56_2_7ce43dd9 local_50;
  
  local_70[0] = this;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,__gnu_cxx::__ops::_Iter_equals_val<N*const>>
                    ((line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var2._M_current ==
      (line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_70[0] = this;
    std::vector<N*,std::allocator<N*>>::emplace_back<N*>
              ((vector<N*,std::allocator<N*>> *)line,local_70);
    all(this);
    std::function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::function(&local_50.alg,alg)
    ;
    std::vector<N_*,_std::allocator<N_*>_>::vector(&local_50.line,line);
    CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>::
    foreach<N::histo(std::function<void(N&,std::vector<N*,std::allocator<N*>>&)>const&,std::vector<N*,std::allocator<N*>>)::_lambda(N*)_1_>
              ((CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N> *)
               local_70,&local_50);
    histo(std::function<void(N&,std::vector<N*,std::allocator<N*>>&)>const&,std::vector<N*,std::allocator<N*>>)
    ::{lambda(N*)#1}::~function((_lambda_N___1_ *)&local_50);
    pppNVar1 = &(line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + -1;
  }
  std::function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::operator()(alg,this,line);
  return;
}

Assistant:

void histo(const alg::Alg<void>& alg, vector<N*> line = {}) {
        if (find(line.begin(), line.end(), this) != line.end()) return alg(*this, line);
        line.push_back(this);

        this->all().foreach([alg, line](N* n){n->histo(alg, line);});

        line.pop_back();
        return alg(*this, line);
    }